

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall Logger::createLogFile(Logger *this)

{
  string *this_00;
  char cVar1;
  ostream *poVar2;
  string sStack_38;
  
  getCurrentLogFileName_abi_cxx11_(&sStack_38,this);
  this_00 = &this->logFileName;
  std::__cxx11::string::operator=((string *)this_00,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::ofstream::open((string *)&this->logfp,(_Ios_Openmode)this_00);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to create log file: ");
    poVar2 = std::operator<<(poVar2,(string *)this_00);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

inline void createLogFile()  // 创建日志文件
    {
#if defined(_WIN32) || defined(_WIN64)
        logFileName = getCurrentLogFileName();
        // 创建并打开日志文件
        logFileHandle = CreateFile(logFileName.c_str(), GENERIC_WRITE, FILE_SHARE_READ, NULL, CREATE_ALWAYS, FILE_ATTRIBUTE_NORMAL, NULL);
        if (logFileHandle == INVALID_HANDLE_VALUE) {
            std::cerr << "Failed to create log file: " << logFileName << std::endl;
            return;
        }
        // 设置文件指针到文件末尾
        SetFilePointer(logFileHandle, 0, NULL, FILE_END);
#else
        logFileName = getCurrentLogFileName();
        // 创建并打开日志文件
        logfp.open(logFileName, std::ios::app);
        if (!logfp.is_open()) {
            std::cerr << "Failed to create log file: " << logFileName << std::endl;
        }
#endif
    }